

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_test.cc
# Opt level: O1

void intgemm::kernel_relu_test<(intgemm::CPUType)4,signed_char>(void)

{
  byte bVar1;
  char *pcVar2;
  byte bVar3;
  ulong uVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  AlignedVector<signed_char> output;
  AlignedVector<signed_char> input;
  AssertionHandler catchAssertionHandler;
  uint local_134;
  AlignedVector<signed_char> local_130;
  AlignedVector<signed_char> local_120;
  SourceLineInfo local_110;
  ITransientExpression local_100;
  undefined1 *local_f0;
  char *local_e8;
  size_t sStack_e0;
  uint *local_d8;
  StringRef local_d0;
  AssertionHandler local_c0;
  undefined1 local_78 [64];
  
  if (3 < kCPU) {
    AlignedVector<signed_char>::AlignedVector(&local_120,0x40,0x40);
    AlignedVector<signed_char>::AlignedVector(&local_130,0x40,0x40);
    if (local_120.size_ != 0) {
      auVar5 = vpbroadcastq_avx512f();
      auVar6 = vmovdqa64_avx512f(_DAT_001bad00);
      uVar4 = 0;
      auVar7 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
      auVar8 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
      auVar9 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
      auVar10 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
      auVar11 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
      auVar12 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
      auVar13 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar15 = vpbroadcastb_avx512bw(ZEXT116(0x40));
      do {
        auVar16 = vpbroadcastq_avx512f();
        auVar17 = vporq_avx512f(auVar16,auVar7);
        auVar18 = vporq_avx512f(auVar16,auVar8);
        auVar19 = vporq_avx512f(auVar16,auVar9);
        auVar20 = vporq_avx512f(auVar16,auVar10);
        auVar21 = vporq_avx512f(auVar16,auVar11);
        auVar22 = vporq_avx512f(auVar16,auVar12);
        auVar23 = vporq_avx512f(auVar16,auVar13);
        auVar16 = vporq_avx512f(auVar16,auVar14);
        vpcmpuq_avx512f(auVar16,auVar5,2);
        vpcmpuq_avx512f(auVar23,auVar5,2);
        vpcmpuq_avx512f(auVar22,auVar5,2);
        vpcmpuq_avx512f(auVar21,auVar5,2);
        vpcmpuq_avx512f(auVar20,auVar5,2);
        vpcmpuq_avx512f(auVar19,auVar5,2);
        vpcmpuq_avx512f(auVar18,auVar5,2);
        vpcmpuq_avx512f(auVar17,auVar5,2);
        auVar16 = vmovdqu8_avx512bw(auVar6);
        *(undefined1 (*) [64])(local_120.mem_ + uVar4) = auVar16;
        uVar4 = uVar4 + 0x40;
        auVar6 = vpaddb_avx512bw(auVar6,auVar15);
      } while ((local_120.size_ + 0x3f & 0xffffffffffffffc0) != uVar4);
    }
    auVar5 = vmovdqa64_avx512f(*(undefined1 (*) [64])local_120.mem_);
    if (kernels::relu<signed_char>(intgemm::vector_s<(intgemm::CPUType)4,signed_char>::type)::
        vconst_zero == '\0') {
      local_78 = vmovdqu64_avx512f(auVar5);
      kernel_relu_test<(intgemm::CPUType)4,signed_char>();
      auVar5 = vmovdqu64_avx512f(local_78);
    }
    auVar5 = vpmaxsb_avx512bw(auVar5,kernels::
                                     relu<signed_char>(intgemm::vector_s<(intgemm::CPUType)4,signed_char>::type)
                                     ::vconst_zero);
    auVar5 = vmovdqa64_avx512f(auVar5);
    *(undefined1 (*) [64])local_130.mem_ = auVar5;
    if (local_130.size_ != 0) {
      uVar4 = 0;
      do {
        local_100._vptr_ITransientExpression = (_func_int **)0x1b3b11;
        local_100.m_isBinaryExpression = true;
        local_100.m_result = false;
        local_100._10_6_ = 0;
        local_110.file =
             "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/relu_test.cc"
        ;
        local_110.line = 0x19;
        Catch::StringRef::StringRef(&local_d0,"output[i] == (input[i] < 0 ? 0 : input[i])");
        Catch::AssertionHandler::AssertionHandler
                  (&local_c0,(StringRef *)&local_100,&local_110,local_d0,ContinueOnFailure);
        pcVar2 = local_130.mem_;
        bVar3 = local_120.mem_[uVar4];
        if (local_120.mem_[uVar4] < '\x01') {
          bVar3 = 0;
        }
        local_134 = (uint)bVar3;
        bVar1 = local_130.mem_[uVar4];
        Catch::StringRef::StringRef((StringRef *)&local_110,"==");
        local_100.m_result = bVar3 == bVar1;
        local_100.m_isBinaryExpression = true;
        local_f0 = pcVar2 + uVar4;
        local_100._vptr_ITransientExpression =
             (_func_int **)&PTR_streamReconstructedExpression_001edb98;
        local_e8 = local_110.file;
        sStack_e0 = local_110.line;
        local_d8 = &local_134;
        Catch::AssertionHandler::handleExpr(&local_c0,&local_100);
        Catch::ITransientExpression::~ITransientExpression(&local_100);
        Catch::AssertionHandler::complete(&local_c0);
        if (local_c0.m_completed == false) {
          (*(local_c0.m_resultCapture)->_vptr_IResultCapture[0xe])
                    (local_c0.m_resultCapture,&local_c0);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < local_130.size_);
    }
    free(local_130.mem_);
    free(local_120.mem_);
  }
  return;
}

Assistant:

void kernel_relu_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, ElemType_>;
  constexpr int VECTOR_LENGTH = sizeof(vec_t) / sizeof(ElemType_);

  AlignedVector<ElemType_> input(VECTOR_LENGTH);
  AlignedVector<ElemType_> output(VECTOR_LENGTH);

  std::iota(input.begin(), input.end(), static_cast<ElemType_>(-VECTOR_LENGTH / 2));

  *output.template as<vec_t>() = kernels::relu<ElemType_>(*input.template as<vec_t>());
  for (std::size_t i = 0; i < output.size(); ++i)
    CHECK(output[i] == (input[i] < 0 ? 0 : input[i]));
}